

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O2

Path * pathSolve(Path *param_1,int *param_2,int param_3,int param_4)

{
  byte bVar1;
  Path *pPVar2;
  int *piVar3;
  _Bool _Var4;
  int iVar5;
  TileNode *pTVar6;
  long lVar7;
  uint uVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  byte bVar11;
  undefined8 auStack_558 [158];
  int local_64;
  Path *local_60;
  int *local_58;
  int local_4c;
  long local_48;
  long local_40;
  ulong local_38;
  
  bVar11 = 0;
  local_64 = param_3 + 1;
  local_58 = param_2 + param_3;
  local_60 = param_1;
  while( true ) {
    local_4c = param_4 + -1;
    iVar5 = local_4c / 0x48;
    local_38 = (ulong)(uint)(iVar5 * -0x48);
    uVar8 = param_4 + iVar5 * -0x48;
    _Var4 = beenChecked(param_2,param_4 + 0x48);
    local_48 = (long)(int)uVar8;
    if (!_Var4) {
      bVar1 = (&stack0x00000054)[local_48 + (long)(iVar5 + 1) * 0x49];
      if (((ulong)bVar1 < 0x2f) && ((0x407800000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        *local_58 = param_4;
        pTVar6 = createTileNode(param_4,bVar1);
        pPVar2 = local_60;
        pushToPath(pTVar6,local_60);
        puVar9 = (undefined8 *)&stack0x00000008;
        puVar10 = auStack_558;
        for (lVar7 = 0x9e; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar10 = *puVar9;
          puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        pathSolve(pPVar2,param_2,local_64,param_4 + 0x48);
      }
    }
    _Var4 = beenChecked(param_2,param_4 + 1);
    local_40 = (long)iVar5;
    if (!_Var4) {
      bVar1 = (&stack0x00000054)[(long)((int)local_38 + param_4 + 1) + local_40 * 0x49];
      if (((ulong)bVar1 < 0x2f) && ((0x407800000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
        *local_58 = param_4;
        pTVar6 = createTileNode(param_4,bVar1);
        pPVar2 = local_60;
        pushToPath(pTVar6,local_60);
        puVar9 = (undefined8 *)&stack0x00000008;
        puVar10 = auStack_558;
        for (lVar7 = 0x9e; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar10 = *puVar9;
          puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        pathSolve(pPVar2,param_2,local_64,param_4 + 1);
      }
    }
    if (0x48 < param_4) {
      _Var4 = beenChecked(param_2,param_4 + -0x48);
      if (!_Var4) {
        bVar1 = (&stack0x00000054)[local_48 + (long)(iVar5 + -1) * 0x49];
        if (((ulong)bVar1 < 0x2f) && ((0x407800000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          *local_58 = param_4;
          pTVar6 = createTileNode(param_4,bVar1);
          pPVar2 = local_60;
          pushToPath(pTVar6,local_60);
          puVar9 = (undefined8 *)&stack0x00000008;
          puVar10 = auStack_558;
          for (lVar7 = 0x9e; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar10 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
            puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
          }
          pathSolve(pPVar2,param_2,local_64,param_4 + -0x48);
        }
      }
    }
    iVar5 = local_4c;
    if ((int)uVar8 < 1) {
      return local_60;
    }
    _Var4 = beenChecked(param_2,local_4c);
    piVar3 = local_58;
    if (_Var4) {
      return local_60;
    }
    lVar7 = local_40 * 0x49 + 0x54;
    if (0x2e < (ulong)(byte)(&stack0x00000054)
                            [(ulong)(((int)local_38 + param_4) - 1) + lVar7 + -0x54]) break;
    if ((0x407800000000U >>
         ((ulong)(byte)(&stack0x00000054)[(ulong)(((int)local_38 + param_4) - 1) + lVar7 + -0x54] &
         0x3f) & 1) == 0) {
      return local_60;
    }
    *local_58 = param_4;
    pTVar6 = createTileNode(param_4,(&stack0x00000054)[(ulong)uVar8 + lVar7 + -0x54]);
    pushToPath(pTVar6,local_60);
    local_64 = local_64 + 1;
    local_58 = piVar3 + 1;
    param_4 = iVar5;
  }
  return local_60;
}

Assistant:

struct Path *pathSolve(struct Map map, struct Path *path, int prevChecked[],
    int count, int currentPosition) {
    int i, j, nextPosition, beingChecked;

    i = (currentPosition - 1) / MAP_COLS;
    j = currentPosition - (MAP_COLS * i);

    beingChecked = ((i + 1) * MAP_COLS) + j;

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i + 1][j])) {
        nextPosition = currentPosition + MAP_COLS;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i + 1][j]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = (i * MAP_COLS) + (j + 1);

    if (!beenChecked(prevChecked, beingChecked) &&
        isPathCharacter(map.overlay[i][j + 1])) {
        nextPosition = currentPosition + 1;
        prevChecked[count] = currentPosition;
        pushToPath(createTileNode(currentPosition, map.overlay[i][j + 1]),
            path);
        pathSolve(map, path, prevChecked, count + 1, nextPosition);
    }

    beingChecked = ((i - 1) * MAP_COLS) + j;

    if (i > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i - 1][j])) {
            nextPosition = currentPosition - MAP_COLS;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i - 1][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    beingChecked = (i * MAP_COLS) + (j - 1);

    if (j > 0) {
        if (!beenChecked(prevChecked, beingChecked) &&
            isPathCharacter(map.overlay[i][j - 1])) {
            nextPosition = currentPosition - 1;
            prevChecked[count] = currentPosition;
            pushToPath(createTileNode(currentPosition, map.overlay[i][j]),
                path);
            pathSolve(map, path, prevChecked, count + 1, nextPosition);
        }
    }

    return path;
}